

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void bgr_888_to_rgba_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint uVar1;
  uint32_t *puVar2;
  int src_pixel;
  uint32_t *dst_end;
  int dst_gap;
  int src_gap;
  uint32_t *dst_ptr;
  uint8_t *src_ptr;
  int y;
  int sy_local;
  int sx_local;
  int dst_pitch_local;
  void *dst_local;
  int src_pitch_local;
  void *src_local;
  
  src_ptr = (uint8_t *)((long)src + (long)(sx * 3) + (long)(sy * src_pitch));
  dst_ptr = (uint32_t *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  for (y = 0; y < height; y = y + 1) {
    puVar2 = dst_ptr + width;
    for (; dst_ptr < puVar2; dst_ptr = dst_ptr + 1) {
      uVar1 = (uint)*(uint3 *)src_ptr;
      *dst_ptr = (int)(uVar1 & 0xff0000) >> 8 | 0xffU | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      src_ptr = src_ptr + 3;
    }
    src_ptr = src_ptr + (src_pitch / 1 + width * -3);
    dst_ptr = dst_ptr + (dst_pitch / 4 - width);
  }
  return;
}

Assistant:

static void bgr_888_to_rgba_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width * 3;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx * 3;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         #ifdef ALLEGRO_BIG_ENDIAN
         int src_pixel = src_ptr[2] | (src_ptr[1] << 8) | (src_ptr[0] << 16);
         #else
         int src_pixel = src_ptr[0] | (src_ptr[1] << 8) | (src_ptr[2] << 16);
         #endif
         *dst_ptr = ALLEGRO_CONVERT_BGR_888_TO_RGBA_8888(src_pixel);
         src_ptr += 1 * 3;
         dst_ptr += 1;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}